

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

u_int64_t __thiscall
CoreML::MilStoragePython::MilStoragePythonWriter::write_fp16_data
          (MilStoragePythonWriter *this,array_t<unsigned_short,_16> *data)

{
  PyObject *pPVar1;
  uint64_t uVar2;
  ulong uVar3;
  SpanSize<18446744073709551615UL> SVar4;
  pointer ptVar5;
  long lVar6;
  Span<const_MILBlob::Fp16,_18446744073709551615UL> data_00;
  
  pPVar1 = (data->super_array).super_buffer.super_object.super_handle.m_ptr;
  ptVar5 = (pointer)pPVar1[1].ob_refcnt;
  if ((long)*(int *)&pPVar1[1].ob_type == 0) {
    SVar4.m_size = 1;
  }
  else {
    uVar3 = 1;
    lVar6 = 0;
    do {
      uVar3 = uVar3 * *(long *)(pPVar1[2].ob_refcnt + lVar6);
      lVar6 = lVar6 + 8;
    } while ((long)*(int *)&pPVar1[1].ob_type * 8 != lVar6);
    SVar4.m_size = uVar3 & 0x7fffffffffffffff;
  }
  if (SVar4.m_size == 0) {
    ptVar5 = (pointer)0x0;
  }
  data_00.m_size.m_size = SVar4.m_size;
  data_00.m_ptr = ptVar5;
  uVar2 = MILBlob::Blob::StorageWriter::WriteData<MILBlob::Fp16>
                    ((this->m_writer)._M_t.
                     super___uniq_ptr_impl<MILBlob::Blob::StorageWriter,_std::default_delete<MILBlob::Blob::StorageWriter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter_*,_std::default_delete<MILBlob::Blob::StorageWriter>_>
                     .super__Head_base<0UL,_MILBlob::Blob::StorageWriter_*,_false>._M_head_impl,
                     data_00);
  return uVar2;
}

Assistant:

const void *data(Ix... index) const {
        return static_cast<const void *>(detail::array_proxy(m_ptr)->data + offset_at(index...));
    }